

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19f5211::ResizeCspTest_TestResizeCspWorks_Test::TestBody
          (ResizeCspTest_TestResizeCspWorks_Test *this)

{
  aom_img_fmt_t aVar1;
  pointer pFVar2;
  undefined8 *puVar3;
  bool bVar4;
  pointer *__ptr;
  SEARCH_METHODS *message;
  long lVar5;
  bool bVar6;
  ResizingCspVideoSource video;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  aom_img_fmt_t image_formats [2];
  AssertHelper local_98;
  DummyVideoSource local_90;
  HasNewFatalFailureHelper local_60;
  AssertHelper local_48;
  EncoderTest *local_40;
  aom_img_fmt_t local_38 [2];
  
  local_38[0] = AOM_IMG_FMT_I420;
  local_38[1] = AOM_IMG_FMT_I444;
  local_40 = &(this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest;
  lVar5 = 0;
  do {
    aVar1 = *(aom_img_fmt_t *)((long)local_38 + lVar5);
    local_90.super_VideoSource._vptr_VideoSource = (_func_int **)&PTR__DummyVideoSource_01074718;
    local_90.img_ = (aom_image_t *)0x0;
    local_90.limit_ = 100;
    local_90.width_ = 0x50;
    local_90.height_ = 0x40;
    local_90.format_ = AOM_IMG_FMT_I420;
    libaom_test::DummyVideoSource::ReallocImage(&local_90);
    local_90.super_VideoSource._vptr_VideoSource = (_func_int **)&PTR__DummyVideoSource_0108c988;
    if ((local_90.width_ != 0x140) || (local_90.height_ != 0xf0)) {
      local_90.width_ = 0x140;
      local_90.height_ = 0xf0;
      libaom_test::DummyVideoSource::ReallocImage(&local_90);
    }
    if (local_90.format_ != aVar1) {
      local_90.format_ = aVar1;
      libaom_test::DummyVideoSource::ReallocImage(&local_90);
    }
    local_90.limit_ = 0x1e;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.init_flags_ = 0x10000;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.rc_min_quantizer = 0x30;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.rc_max_quantizer = 0x30;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.g_lag_in_frames = 0;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.g_profile =
         (uint)(aVar1 != AOM_IMG_FMT_I420);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(&local_60);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        (*local_40->_vptr_EncoderTest[2])(local_40,&local_90);
      }
      bVar4 = local_60.has_new_fatal_failure_;
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper(&local_60);
      if (bVar4 != false) goto LAB_0069af22;
      local_98.data_ =
           (AssertHelperData *)
           ((long)(this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
      local_48.data_._0_4_ = local_90.limit_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&local_60,"frame_info_list_.size()","video.limit()",
                 (unsigned_long *)&local_98,(uint *)&local_48);
      if ((char)local_60.super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface
          == '\0') {
        testing::Message::Message((Message *)&local_98);
        message = "";
        if ((undefined8 *)CONCAT71(local_60._9_7_,local_60.has_new_fatal_failure_) !=
            (undefined8 *)0x0) {
          message = *(SEARCH_METHODS **)CONCAT71(local_60._9_7_,local_60.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x458,(char *)message);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_98.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
        puVar3 = (undefined8 *)CONCAT71(local_60._9_7_,local_60.has_new_fatal_failure_);
        if (puVar3 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar3 != puVar3 + 2) {
            operator_delete((undefined8 *)*puVar3);
          }
          operator_delete(puVar3);
        }
        goto LAB_0069af6d;
      }
      puVar3 = (undefined8 *)CONCAT71(local_60._9_7_,local_60.has_new_fatal_failure_);
      if (puVar3 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar3 != puVar3 + 2) {
          operator_delete((undefined8 *)*puVar3);
        }
        operator_delete(puVar3);
      }
      pFVar2 = (this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
          super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish != pFVar2) {
        (this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
        super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
      }
      bVar4 = false;
    }
    else {
LAB_0069af22:
      testing::Message::Message((Message *)&local_60);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                 ,0x454,
                 "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT71(local_60.super_TestPartResultReporterInterface.
                           _vptr_TestPartResultReporterInterface._1_7_,
                           (char)local_60.super_TestPartResultReporterInterface.
                                 _vptr_TestPartResultReporterInterface) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_60.super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface._1_7_,
                                       (char)local_60.super_TestPartResultReporterInterface.
                                             _vptr_TestPartResultReporterInterface) + 8))();
      }
LAB_0069af6d:
      bVar4 = true;
    }
    local_90.super_VideoSource._vptr_VideoSource = (_func_int **)&PTR__DummyVideoSource_01074718;
    aom_img_free(local_90.img_);
    bVar6 = lVar5 == 4;
    lVar5 = lVar5 + 4;
    if (bVar4 || bVar6) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(ResizeCspTest, TestResizeCspWorks) {
#endif
  const aom_img_fmt_t image_formats[] = { AOM_IMG_FMT_I420, AOM_IMG_FMT_I444 };
  for (const aom_img_fmt_t &img_format : image_formats) {
    ResizingCspVideoSource video(img_format);
    init_flags_ = AOM_CODEC_USE_PSNR;
    cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = 48;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_profile = (img_format == AOM_IMG_FMT_I420) ? 0 : 1;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
    // Check we decoded the same number of frames as we attempted to encode
    ASSERT_EQ(frame_info_list_.size(), video.limit());
    frame_info_list_.clear();
#endif
  }
}